

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingUtils.h
# Opt level: O3

void NextToken(char **car,char *end)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong uVar3;
  
  pbVar2 = (byte *)*car;
  while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
    pbVar2 = pbVar2 + 1;
  }
  *car = (char *)pbVar2;
  while (((pbVar2 < end && (uVar3 = (ulong)*pbVar2, uVar3 < 0x24)) &&
         ((0x800002400U >> (uVar3 & 0x3f) & 1) != 0))) {
    while ((0xd < (byte)uVar3 || ((0x2401U >> ((uint)uVar3 & 0x1f) & 1) == 0))) {
      uVar3 = (ulong)pbVar2[1];
      pbVar2 = pbVar2 + 1;
    }
    while (((char)uVar3 == '\r' || ((int)uVar3 == 10))) {
      pbVar1 = pbVar2 + 1;
      pbVar2 = pbVar2 + 1;
      uVar3 = (ulong)*pbVar1;
    }
    *car = (char *)pbVar2;
    while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
      pbVar2 = pbVar2 + 1;
    }
    *car = (char *)pbVar2;
  }
  return;
}

Assistant:

AI_FORCE_INLINE
bool SkipSpacesAndLineEnd( const char_t** inout) {
    return SkipSpacesAndLineEnd<char_t>(*inout,inout);
}